

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leg_track.cpp
# Opt level: O1

void __thiscall
cp::LegTrack::setStepVar
          (LegTrack *this,Pose *ref_landpose_leg_w,Quat *ref_waist,rl swingleg,walking_state wstate)

{
  double dVar1;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_28;
  
  *(double *)(this + 0x1e0) = *(double *)(this + 0x1b8);
  *(double *)(this + 0x1e8) = *(double *)(this + 0x1c0);
  *(undefined8 *)(this + 0x1f0) = *(undefined8 *)(this + 0x1b0);
  *(double *)(this + 0x1f8) = *(double *)(this + 0x1b8) + *(double *)(this + 0x1c0);
  *(rl *)(this + 0x440) = swingleg;
  *(walking_state *)(this + 0x444) = wstate;
  *(undefined8 *)(this + 0x610) = *(undefined8 *)(this + 0x260);
  *(undefined8 *)(this + 0x618) = *(undefined8 *)(this + 0x268);
  *(undefined8 *)(this + 0x620) = *(undefined8 *)(this + 0x270);
  *(undefined8 *)(this + 0x630) = *(undefined8 *)(this + 0x280);
  *(undefined8 *)(this + 0x638) = *(undefined8 *)(this + 0x288);
  *(undefined8 *)(this + 0x640) = *(undefined8 *)(this + 0x290);
  *(undefined8 *)(this + 0x648) = *(undefined8 *)(this + 0x298);
  *(undefined8 *)(this + 0x6f0) = *(undefined8 *)(this + 0x340);
  *(undefined8 *)(this + 0x6f8) = *(undefined8 *)(this + 0x348);
  *(undefined8 *)(this + 0x700) = *(undefined8 *)(this + 0x350);
  *(undefined8 *)(this + 0x710) = *(undefined8 *)(this + 0x360);
  *(undefined8 *)(this + 0x718) = *(undefined8 *)(this + 0x368);
  *(undefined8 *)(this + 0x720) = *(undefined8 *)(this + 0x370);
  *(undefined8 *)(this + 0x728) = *(undefined8 *)(this + 0x378);
  dVar1 = (ref_landpose_leg_w->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1];
  *(double *)(this + 0x260) =
       (ref_landpose_leg_w->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  *(double *)(this + 0x268) = dVar1;
  *(double *)(this + 0x270) =
       (ref_landpose_leg_w->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2];
  dVar1 = (ref_landpose_leg_w->qq).m_coeffs.
          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
  *(double *)(this + 0x280) =
       (ref_landpose_leg_w->qq).m_coeffs.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
  *(double *)(this + 0x288) = dVar1;
  dVar1 = (ref_landpose_leg_w->qq).m_coeffs.
          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
  *(double *)(this + 0x290) =
       (ref_landpose_leg_w->qq).m_coeffs.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
  *(double *)(this + 0x298) = dVar1;
  dVar1 = ref_landpose_leg_w[1].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1];
  *(double *)(this + 0x340) =
       ref_landpose_leg_w[1].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  *(double *)(this + 0x348) = dVar1;
  *(double *)(this + 0x350) =
       ref_landpose_leg_w[1].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2];
  dVar1 = ref_landpose_leg_w[1].qq.m_coeffs.
          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
  *(double *)(this + 0x360) =
       ref_landpose_leg_w[1].qq.m_coeffs.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
  *(double *)(this + 0x368) = dVar1;
  dVar1 = ref_landpose_leg_w[1].qq.m_coeffs.
          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
  *(double *)(this + 0x370) =
       ref_landpose_leg_w[1].qq.m_coeffs.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
  *(double *)(this + 0x378) = dVar1;
  *(undefined8 *)(this + 0x240) = *(undefined8 *)(this + 0x220);
  *(undefined8 *)(this + 0x248) = *(undefined8 *)(this + 0x228);
  *(undefined8 *)(this + 0x250) = *(undefined8 *)(this + 0x230);
  *(undefined8 *)(this + 600) = *(undefined8 *)(this + 0x238);
  dVar1 = (ref_waist->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[1];
  *(double *)(this + 0x220) =
       (ref_waist->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  *(double *)(this + 0x228) = dVar1;
  dVar1 = (ref_waist->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[3];
  *(double *)(this + 0x230) =
       (ref_waist->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[2];
  *(double *)(this + 0x238) = dVar1;
  local_28.m_xpr = (Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x420);
  local_28.m_row = 0;
  local_28.m_col = 1;
  local_28.m_currentBlockRows = 1;
  *(Scalar *)(this + 0x420) = *(Scalar *)(this + (ulong)swingleg * 0xe0 + 0x618 + -8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            (&local_28,(Scalar *)(this + (ulong)swingleg * 0xe0 + 0x618));
  if ((local_28.m_currentBlockRows + local_28.m_row == 2) && (local_28.m_col == 1)) {
    local_28.m_xpr = (Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x430);
    local_28.m_row = 0;
    local_28.m_col = 1;
    local_28.m_currentBlockRows = 1;
    *(Scalar *)(this + 0x430) =
         *(Scalar *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x268 + -8);
    Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
              (&local_28,(Scalar *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x268));
    if ((local_28.m_currentBlockRows + local_28.m_row == 2) && (local_28.m_col == 1)) {
      interpolation<double>::setInter5
                ((interpolation<double> *)this,*(double *)(this + 0x1d8),0.0,0.0,
                 *(double *)(this + 0x1d0),0.0,0.0,*(double *)(this + 0x1b8) * 0.5);
      interpolation<double>::setInter5
                ((interpolation<double> *)(this + 0x30),*(double *)(this + 0x1d0),0.0,0.0,
                 *(double *)(this + 0x1d8),0.0,0.0,*(double *)(this + 0x1b8) * 0.5);
      return;
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 1>>::finished() [MatrixType = Eigen::Matrix<double, 2, 1>]"
               );
}

Assistant:

void LegTrack::setStepVar(const Pose ref_landpose_leg_w[],
     const Quat &ref_waist, rl swingleg, walking_state wstate) {
  // set time var of a step
  sst_s = sst;
  dst_s = dst;
  dt_s  = dt;
  st_s = sst_s + dst_s;
  swl = swingleg;
  ws = wstate;
  // set next landing pos
  bfr_landpose[right].set(ref_landpose[right]);
  bfr_landpose[left].set(ref_landpose[left]);
  ref_landpose[right].set(ref_landpose_leg_w[right]);
  ref_landpose[left].set(ref_landpose_leg_w[left]);
  bfr_waist_r = ref_waist_r;
  ref_waist_r = ref_waist;

  // for (x, y) lerp
  bfr << bfr_landpose[swl].p().x(), bfr_landpose[swl].p().y();
  ref << ref_landpose[swl].p().x(), ref_landpose[swl].p().y();
  // for z lerp
  inter_z_1.setInter5(ground_h, 0.0, 0.0, leg_h, 0.0, 0.0, sst*0.5);
  inter_z_2.setInter5(leg_h, 0.0, 0.0, ground_h, 0.0, 0.0, sst*0.5);
}